

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_func_call_arguments.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::FixFuncCallArgumentsPass::FixFuncCallArguments
          (FixFuncCallArgumentsPass *this,Instruction *func_call_inst)

{
  initializer_list<unsigned_int> init_list;
  uint uVar1;
  Instruction *this_00;
  uint32_t uVar2;
  Op OVar3;
  DefUseManager *this_01;
  IRContext *this_02;
  uint32_t local_74;
  iterator local_70;
  undefined8 local_68;
  SmallVector<unsigned_int,_2UL> local_60;
  uint32_t local_34;
  Instruction *pIStack_30;
  uint32_t var_id;
  Instruction *operand_inst;
  Operand *op;
  uint32_t i;
  bool modified;
  Instruction *func_call_inst_local;
  FixFuncCallArgumentsPass *this_local;
  
  op._7_1_ = 0;
  _i = func_call_inst;
  func_call_inst_local = (Instruction *)this;
  for (op._0_4_ = 0; uVar1 = (uint)op, uVar2 = opt::Instruction::NumInOperands(_i), uVar1 < uVar2;
      op._0_4_ = (uint)op + 1) {
    operand_inst = (Instruction *)opt::Instruction::GetInOperand(_i,(uint)op);
    if (*(spv_operand_type_t *)
         &(operand_inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase == SPV_OPERAND_TYPE_ID) {
      this_01 = Pass::get_def_use_mgr(&this->super_Pass);
      uVar2 = Operand::AsId((Operand *)operand_inst);
      pIStack_30 = analysis::DefUseManager::GetDef(this_01,uVar2);
      OVar3 = opt::Instruction::opcode(pIStack_30);
      if (OVar3 == OpAccessChain) {
        local_74 = ReplaceAccessChainFuncCallArguments(this,_i,pIStack_30);
        this_00 = _i;
        uVar2 = (uint)op;
        local_70 = &local_74;
        local_68 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_70;
        local_34 = local_74;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_60,init_list);
        opt::Instruction::SetInOperand(this_00,uVar2,&local_60);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_60);
        op._7_1_ = 1;
      }
    }
  }
  if ((op._7_1_ & 1) != 0) {
    this_02 = Pass::context(&this->super_Pass);
    IRContext::UpdateDefUse(this_02,_i);
  }
  return (bool)(op._7_1_ & 1);
}

Assistant:

bool FixFuncCallArgumentsPass::FixFuncCallArguments(
    Instruction* func_call_inst) {
  bool modified = false;
  for (uint32_t i = 0; i < func_call_inst->NumInOperands(); ++i) {
    Operand& op = func_call_inst->GetInOperand(i);
    if (op.type != SPV_OPERAND_TYPE_ID) continue;
    Instruction* operand_inst = get_def_use_mgr()->GetDef(op.AsId());
    if (operand_inst->opcode() == spv::Op::OpAccessChain) {
      uint32_t var_id =
          ReplaceAccessChainFuncCallArguments(func_call_inst, operand_inst);
      func_call_inst->SetInOperand(i, {var_id});
      modified = true;
    }
  }
  if (modified) {
    context()->UpdateDefUse(func_call_inst);
  }
  return modified;
}